

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mioUtils.c
# Opt level: O2

Mio_Cell2_t * Mio_CollectRootsNew2(Mio_Library_t *pLib,int nInputs,int *pnGates,int fVerbose)

{
  Mio_Pin_t *pMVar1;
  long lVar2;
  long lVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  Mio_Cell2_t *pMVar7;
  undefined8 *__ptr;
  Mio_Gate_t *pMVar8;
  long lVar9;
  void *__ptr_00;
  long lVar10;
  ulong uVar11;
  word *pwVar12;
  int iVar13;
  Mio_Cell2_t *pMVar14;
  uint uVar15;
  undefined8 *puVar16;
  char *__s;
  Mio_Pin_t **ppMVar17;
  int *piVar18;
  int iVar19;
  undefined8 *puVar20;
  ulong uVar21;
  bool bVar22;
  byte bVar23;
  double dVar24;
  
  bVar23 = 0;
  iVar5 = Mio_LibraryReadGateNum(pLib);
  pMVar7 = (Mio_Cell2_t *)calloc((long)(iVar5 + 4),0x50);
  __ptr = (undefined8 *)calloc((long)iVar5,0x50);
  pMVar8 = Mio_LibraryReadGates(pLib);
  iVar13 = 0;
  for (; lVar9 = (long)iVar13, pMVar8 != (Mio_Gate_t *)0x0; pMVar8 = Mio_GateReadNext(pMVar8)) {
    uVar15 = pMVar8->nInputs;
    if (((int)uVar15 <= nInputs) && (pMVar8->pTwin == (Mio_Gate_t *)0x0)) {
      __ptr[lVar9 * 10] = pMVar8->pName;
      __ptr[lVar9 * 10 + 1] = pMVar8->vExpr;
      *(anon_union_8_2_ab88de1c_for_Mio_GateStruct_t__15 *)(__ptr + lVar9 * 10 + 4) =
           pMVar8->field_15;
      dVar24 = pMVar8->dArea;
      *(float *)((long)__ptr + lVar9 * 0x50 + 0x14) = (float)dVar24;
      dVar24 = dVar24 * 1000.0;
      uVar11 = (ulong)dVar24;
      __ptr[lVar9 * 10 + 3] = (long)(dVar24 - 9.223372036854776e+18) & (long)uVar11 >> 0x3f | uVar11
      ;
      *(uint *)(__ptr + lVar9 * 10 + 2) =
           *(uint *)(__ptr + lVar9 * 10 + 2) & 0xfffffff | uVar15 << 0x1c;
      __ptr[lVar9 * 10 + 9] = pMVar8;
      *(undefined4 *)(__ptr + lVar9 * 10 + 5) = 0;
      piVar18 = (int *)((long)__ptr + lVar9 * 0x50 + 0x2c);
      iVar6 = 0;
      ppMVar17 = &pMVar8->pPins;
      while (pMVar1 = *ppMVar17, pMVar1 != (Mio_Pin_t *)0x0) {
        iVar19 = (int)(pMVar1->dDelayBlockRise * 500.0 + pMVar1->dDelayBlockFall * 500.0);
        *piVar18 = iVar19;
        iVar6 = iVar6 + iVar19;
        *(int *)(__ptr + lVar9 * 10 + 5) = iVar6;
        piVar18 = piVar18 + 1;
        ppMVar17 = &pMVar1->pNext;
      }
      iVar13 = iVar13 + 1;
      if ((uVar15 & 0xf) != 0) {
        *(int *)(__ptr + lVar9 * 10 + 5) = iVar6 / (int)(uVar15 & 0xf);
      }
    }
  }
  if (iVar5 < iVar13) {
    __assert_fail("iCell0 <= nGates",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/mio/mioUtils.c"
                  ,0x2b0,"Mio_Cell2_t *Mio_CollectRootsNew2(Mio_Library_t *, int, int *, int)");
  }
  uVar15 = 4;
  lVar3 = 10;
  puVar20 = __ptr;
  do {
    if (__ptr + lVar9 * 10 <= puVar20) {
      free(__ptr);
      if (pMVar7->pName == (char *)0x0) {
        __s = "Error: Cannot find constant 0 gate in the library.";
      }
      else if (pMVar7[1].pName == (char *)0x0) {
        __s = "Error: Cannot find constant 1 gate in the library.";
      }
      else if (pMVar7[2].pName == (char *)0x0) {
        __s = "Error: Cannot find buffer gate in the library.";
      }
      else {
        if (pMVar7[3].pName != (char *)0x0) {
          if (5 < (int)uVar15) {
            qsort(pMVar7 + 4,(ulong)(uVar15 - 4),0x50,Mio_AreaCompare2);
            iVar13 = Mio_AreaCompare2(pMVar7 + 4,pMVar7 + ((ulong)uVar15 - 1));
            if (0 < iVar13) {
              __assert_fail("Mio_AreaCompare2( ppCells + 4, ppCells + iCell - 1 ) <= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/mio/mioUtils.c"
                            ,0x2de,
                            "Mio_Cell2_t *Mio_CollectRootsNew2(Mio_Library_t *, int, int *, int)");
            }
          }
          for (pMVar8 = Mio_LibraryReadGates(pLib); pMVar8 != (Mio_Gate_t *)0x0;
              pMVar8 = Mio_GateReadNext(pMVar8)) {
            Mio_GateSetCell(pMVar8,-1);
          }
          uVar11 = 0;
          uVar21 = 0;
          pMVar14 = pMVar7;
          if (0 < (int)uVar15) {
            uVar21 = (ulong)uVar15;
          }
          for (; uVar21 != uVar11; uVar11 = uVar11 + 1) {
            uVar4 = (uint)uVar11 & 0x3ffffff;
            if (pMVar14->pName == (char *)0x0) {
              uVar4 = 0x3ffffff;
            }
            *(uint *)&pMVar14->field_0x10 = *(uint *)&pMVar14->field_0x10 & 0xfc000000 | uVar4;
            Mio_GateSetCell((Mio_Gate_t *)pMVar14->pMioGate,(uint)uVar11);
            pMVar14 = pMVar14 + 1;
          }
          if (fVerbose != 0) {
            __ptr_00 = calloc((long)(iVar5 + 4),4);
            pMVar8 = Mio_LibraryReadGates(pLib);
            for (; pMVar8 != (Mio_Gate_t *)0x0; pMVar8 = Mio_GateReadNext(pMVar8)) {
              if ((pMVar8->nInputs <= nInputs) && (pMVar8->pTwin == (Mio_Gate_t *)0x0)) {
                uVar11 = 0;
                pwVar12 = &pMVar7->uTruth;
                while( true ) {
                  if (uVar21 == uVar11) {
                    __assert_fail("i < iCell",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/mio/mioUtils.c"
                                  ,0x2f8,
                                  "Mio_Cell2_t *Mio_CollectRootsNew2(Mio_Library_t *, int, int *, int)"
                                 );
                  }
                  if ((((Mio_Cell2_t *)(pwVar12 + -4))->pName != (char *)0x0) &&
                     (*pwVar12 == (pMVar8->field_15).uTruth)) break;
                  uVar11 = uVar11 + 1;
                  pwVar12 = pwVar12 + 10;
                }
                piVar18 = (int *)((long)__ptr_00 + uVar11 * 4);
                *piVar18 = *piVar18 + 1;
              }
            }
            pMVar14 = pMVar7;
            for (uVar11 = 0; uVar21 != uVar11; uVar11 = uVar11 + 1) {
              printf("%4d : ",uVar11 & 0xffffffff);
              if (pMVar14->pName == (char *)0x0) {
                puts("None");
              }
              else {
                printf("%-20s   In = %d   N = %3d   A = %12.6f   D = %12.6f\n",
                       (double)pMVar14->AreaF,(double)((float)pMVar14->iDelayAve / 1000.0),
                       pMVar14->pName,(ulong)(*(uint *)&pMVar14->field_0x10 >> 0x1c),
                       (ulong)*(uint *)((long)__ptr_00 + uVar11 * 4));
              }
              pMVar14 = pMVar14 + 1;
            }
            free(__ptr_00);
          }
          if (pnGates == (int *)0x0) {
            return pMVar7;
          }
          *pnGates = uVar15;
          return pMVar7;
        }
        __s = "Error: Cannot find inverter gate in the library.";
      }
      puts(__s);
      return (Mio_Cell2_t *)0x0;
    }
    uVar11 = 0;
    pMVar14 = pMVar7;
    if (0 < (int)uVar15) {
      uVar11 = (ulong)uVar15;
    }
    while (bVar22 = uVar11 != 0, uVar11 = uVar11 - 1, lVar10 = lVar3, puVar16 = puVar20, bVar22) {
      if ((pMVar14->pName != (char *)0x0) && (pMVar14->uTruth == puVar20[4])) {
        uVar11 = puVar20[3];
        uVar21 = pMVar14->AreaW;
        if (uVar21 >= uVar11 && uVar21 != uVar11) goto code_r0x0034e74c;
        if (uVar21 < uVar11) goto LAB_0034e74f;
        if (*(int *)(puVar20 + 5) < pMVar14->iDelayAve) goto code_r0x0034e74c;
        if (pMVar14->iDelayAve < *(int *)(puVar20 + 5)) goto LAB_0034e74f;
        iVar13 = strcmp(pMVar14->pName,(char *)*puVar20);
        if (0 < iVar13) goto code_r0x0034e74c;
        if (-1 < iVar13) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/mio/mioUtils.c"
                        ,0x28c,"int Mio_CompareTwo2(Mio_Cell2_t *, Mio_Cell2_t *)");
        }
        goto LAB_0034e74f;
      }
      pMVar14 = pMVar14 + 1;
    }
    lVar2 = puVar20[4];
    if (lVar2 + 1U < 2) {
      if (0xfffffff < *(uint *)(puVar20 + 2)) {
        __assert_fail("pCell->nFanins == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/mio/mioUtils.c"
                      ,0x2c3,"Mio_Cell2_t *Mio_CollectRootsNew2(Mio_Library_t *, int, int *, int)");
      }
      uVar11 = (ulong)(lVar2 == -1);
LAB_0034e740:
      pMVar14 = pMVar7 + uVar11;
    }
    else {
      if ((lVar2 != -0x5555555555555556) && (lVar2 != 0x5555555555555555)) {
        uVar11 = (ulong)(int)uVar15;
        uVar15 = uVar15 + 1;
        goto LAB_0034e740;
      }
      if ((*(uint *)(puVar20 + 2) & 0xf0000000) != 0x10000000) {
        __assert_fail("pCell->nFanins == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/mio/mioUtils.c"
                      ,0x2ca,"Mio_Cell2_t *Mio_CollectRootsNew2(Mio_Library_t *, int, int *, int)");
      }
      pMVar14 = pMVar7 + 2;
      if (lVar2 == 0x5555555555555555) {
        pMVar14 = pMVar7 + 3;
      }
    }
code_r0x0034e74c:
    for (; lVar10 != 0; lVar10 = lVar10 + -1) {
      pMVar14->pName = (char *)*puVar16;
      puVar16 = puVar16 + (ulong)bVar23 * -2 + 1;
      pMVar14 = (Mio_Cell2_t *)((long)pMVar14 + (ulong)bVar23 * -0x10 + 8);
    }
LAB_0034e74f:
    puVar20 = puVar20 + 10;
  } while( true );
}

Assistant:

Mio_Cell2_t * Mio_CollectRootsNew2( Mio_Library_t * pLib, int nInputs, int * pnGates, int fVerbose )
{
    Mio_Gate_t * pGate0;
    Mio_Cell2_t * ppCells0, * ppCells, * pCell;
    int i, nGates, iCell0 = 0, iCell = 4;
    // create space for new cells
    nGates = Mio_LibraryReadGateNum( pLib );
    ppCells  = ABC_CALLOC( Mio_Cell2_t, nGates + 4 );
    // copy all gates first
    ppCells0 = ABC_CALLOC( Mio_Cell2_t, nGates );
    Mio_LibraryForEachGate( pLib, pGate0 )
        if ( !(pGate0->nInputs > nInputs || pGate0->pTwin) ) // skip large and multi-output
            Mio_CollectCopy2( ppCells0 + iCell0++, pGate0 );
    assert( iCell0 <= nGates );
    // for each functionality, select gate with the smallest area
    // if equal areas, select gate with smaller average pin delay
    // if these are also equal, select lexicographically smaller name
    for ( pCell = ppCells0; pCell < ppCells0 + iCell0; pCell++ )
    {
        // check if the gate with this functionality already exists
        for ( i = 0; i < iCell; i++ )
            if ( ppCells[i].pName && ppCells[i].uTruth == pCell->uTruth )
            {
                if ( Mio_CompareTwo2( ppCells + i, pCell ) )
                    ppCells[i] = *pCell;
                break;
            }
        if ( i < iCell )
            continue;
        if ( pCell->uTruth == 0 || pCell->uTruth == ~(word)0 )
        {
            int Idx = (int)(pCell->uTruth == ~(word)0);
            assert( pCell->nFanins == 0 );
            ppCells[Idx] = *pCell;
            continue;
        }
        if ( pCell->uTruth == ABC_CONST(0xAAAAAAAAAAAAAAAA) || pCell->uTruth == ~ABC_CONST(0xAAAAAAAAAAAAAAAA) )
        {
            int Idx = 2 + (int)(pCell->uTruth == ~ABC_CONST(0xAAAAAAAAAAAAAAAA));
            assert( pCell->nFanins == 1 );
            ppCells[Idx] = *pCell;
            continue;
        }
        ppCells[iCell++] = *pCell;
    }
    ABC_FREE( ppCells0 );
    if ( ppCells[0].pName == NULL )
        { printf( "Error: Cannot find constant 0 gate in the library.\n" ); return NULL; }
    if ( ppCells[1].pName == NULL )
        { printf( "Error: Cannot find constant 1 gate in the library.\n" ); return NULL; }
    if ( ppCells[2].pName == NULL )
        { printf( "Error: Cannot find buffer gate in the library.\n" );     return NULL; }
    if ( ppCells[3].pName == NULL )
        { printf( "Error: Cannot find inverter gate in the library.\n" );   return NULL; }
    // sort by delay
    if ( iCell > 5 ) 
    {
        qsort( (void *)(ppCells + 4), (size_t)(iCell - 4), sizeof(Mio_Cell2_t), 
                (int (*)(const void *, const void *)) Mio_AreaCompare2 );
        assert( Mio_AreaCompare2( ppCells + 4, ppCells + iCell - 1 ) <= 0 );
    }
    // assign IDs
    Mio_LibraryForEachGate( pLib, pGate0 )
        Mio_GateSetCell( pGate0, -1 );
    for ( i = 0; i < iCell; i++ )
    {
        ppCells[i].Id = ppCells[i].pName ? i : -1;
        Mio_GateSetCell( (Mio_Gate_t *)ppCells[i].pMioGate, i );
    }

    // report
    if ( fVerbose )
    {
        // count gates
        int * pCounts = ABC_CALLOC( int, nGates + 4 );
        Mio_LibraryForEachGate( pLib, pGate0 )
        {
            if ( pGate0->nInputs > nInputs || pGate0->pTwin ) // skip large and multi-output
                continue;
            for ( i = 0; i < iCell; i++ )
                if ( ppCells[i].pName && ppCells[i].uTruth == pGate0->uTruth )
                {
                    pCounts[i]++;
                    break;
                }
            assert( i < iCell );
        }
        for ( i = 0; i < iCell; i++ )
        {
            Mio_Cell2_t * pCell = ppCells + i;
            printf( "%4d : ", i );
            if ( pCell->pName == NULL )
                printf( "None\n" );
            else
                printf( "%-20s   In = %d   N = %3d   A = %12.6f   D = %12.6f\n", 
                    pCell->pName, pCell->nFanins, pCounts[i], pCell->AreaF, Scl_Int2Flt(pCell->iDelayAve) );
        }
        ABC_FREE( pCounts );
    }
    if ( pnGates )
        *pnGates = iCell;
    return ppCells;
}